

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

char * makekey(uint8 *data,size_t len,char *key)

{
  long local_30;
  size_t j;
  size_t i;
  char *key_local;
  size_t len_local;
  uint8 *data_local;
  
  i = (size_t)key;
  if (key == (char *)0x0) {
    i = (size_t)__ckd_calloc__(len * 2 + 1,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/hash_table.c"
                               ,0xde);
  }
  local_30 = 0;
  for (j = 0; j < len; j = j + 1) {
    *(byte *)(i + local_30) = (data[j] & 0xf) + 0x41;
    *(char *)(i + 1 + local_30) = (char)((int)(uint)data[j] >> 4) + 'J';
    local_30 = local_30 + 2;
  }
  *(undefined1 *)(i + local_30) = 0;
  return (char *)i;
}

Assistant:

static char *
makekey(uint8 * data, size_t len, char *key)
{
    size_t i, j;

    if (!key)
        key = (char *) ckd_calloc(len * 2 + 1, sizeof(char));

    for (i = 0, j = 0; i < len; i++, j += 2) {
        key[j] = 'A' + (data[i] & 0x000f);
        key[j + 1] = 'J' + ((data[i] >> 4) & 0x000f);
    }
    key[j] = '\0';

    return key;
}